

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O3

void __thiscall miniros::Publisher::Impl::~Impl(Impl *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_30;
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (~Impl::loc.initialized_ == false) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"miniros.unknown_package","");
    console::initializeLogLocation(&~Impl::loc,&local_30,Debug);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (~Impl::loc.level_ != Debug) {
    console::setLogLocationLevel(&~Impl::loc,Debug);
    console::checkLogLocationEnabled(&~Impl::loc);
  }
  if (~Impl::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,~Impl::loc.logger_,~Impl::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/publisher.cpp"
                   ,0x28,"miniros::Publisher::Impl::~Impl()",
                   "Publisher on \'%s\' deregistering callbacks.",(this->topic_)._M_dataplus._M_p);
  }
  unadvertise(this);
  p_Var1 = (this->callbacks_).
           super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->node_handle_).super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pcVar2 = (this->datatype_)._M_dataplus._M_p;
  paVar3 = &(this->datatype_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->md5sum_)._M_dataplus._M_p;
  paVar3 = &(this->md5sum_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->topic_)._M_dataplus._M_p;
  paVar3 = &(this->topic_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Publisher::Impl::~Impl()
{
  MINIROS_DEBUG("Publisher on '%s' deregistering callbacks.", topic_.c_str());
  unadvertise();
}